

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::SurfaceAttribPbufferCase::executeForConfig
          (SurfaceAttribPbufferCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  deUint32 err;
  EGLint EVar3;
  EGLint EVar4;
  int iVar5;
  Library *egl;
  undefined4 extraout_var;
  int iVar6;
  UniqueSurface surface;
  ConfigInfo local_258;
  EGLint attribs [7];
  
  egl = EglTestContext::getLibrary
                  ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                   m_eglTestCtx);
  pTVar2 = ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_258.transparentRedValue = 0;
  local_258.transparentGreenValue = 0;
  local_258.transparentBlueValue = 0;
  local_258.samples = 0;
  local_258.stencilSize = 0;
  local_258.surfaceType = 0;
  local_258.transparentType = 0;
  local_258.nativeVisualId = 0;
  local_258.nativeVisualType = 0;
  local_258.renderableType = 0;
  local_258.sampleBuffers = 0;
  local_258.maxPbufferHeight = 0;
  local_258.maxSwapInterval = 0;
  local_258.minSwapInterval = 0;
  local_258.nativeRenderable = 0;
  local_258.conformant = 0;
  local_258.depthSize = 0;
  local_258.level = 0;
  local_258.maxPbufferWidth = 0;
  local_258.bindToTextureRGBA = 0;
  local_258.colorBufferType = 0;
  local_258.configCaveat = 0;
  local_258.configId = 0;
  local_258.luminanceSize = 0;
  local_258.alphaSize = 0;
  local_258.alphaMaskSize = 0;
  local_258.bindToTextureRGB = 0;
  local_258.bufferSize = 0;
  local_258.redSize = 0;
  local_258.greenSize = 0;
  local_258.blueSize = 0;
  local_258.yuvOrder = 0x3038;
  local_258.yuvNumberOfPlanes = 0;
  local_258.yuvSubsample = 0x3038;
  local_258.yuvDepthRange = 0x3038;
  local_258.yuvCscStandard = 0x3038;
  local_258.yuvPlaneBpp = 0x331b;
  local_258.colorComponentType = 0x3038;
  eglu::queryCoreConfigInfo(egl,display,config,&local_258);
  poVar1 = (ostringstream *)(attribs + 2);
  attribs._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Creating pbuffer surface with config ID ");
  std::ostream::operator<<(poVar1,local_258.configId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)attribs,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x285);
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x302c);
  iVar5 = 0x40;
  if (EVar3 < 0x40) {
    iVar5 = EVar3;
  }
  EVar4 = eglu::getConfigAttribInt(egl,display,config,0x302a);
  iVar6 = 0x40;
  if (EVar4 < 0x40) {
    iVar6 = EVar4;
  }
  if (EVar3 == 0 || EVar4 == 0) {
    poVar1 = (ostringstream *)(attribs + 2);
    attribs._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, maximum pbuffer size of ");
    std::ostream::operator<<(poVar1,iVar5);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,iVar6);
    std::operator<<((ostream *)poVar1," reported");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attribs,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid maximum pbuffer size");
  }
  else {
    attribs[1] = iVar5;
    attribs[0] = 0x3057;
    attribs[2] = 0x3056;
    attribs[4] = 0x3080;
    attribs[5] = 0x305c;
    attribs[6] = 0x3038;
    attribs[3] = iVar6;
    iVar5 = (*egl->_vptr_Library[10])(egl,display,config);
    eglu::UniqueSurface::UniqueSurface
              (&surface,egl,display,(EGLSurface)CONCAT44(extraout_var,iVar5));
    SurfaceAttribCase::testAttributes
              (&this->super_SurfaceAttribCase,display,surface.m_surface,1,&local_258);
    eglu::UniqueSurface::~UniqueSurface(&surface);
  }
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		tcu::TestLog&	log		= m_testCtx.getLog();
		int				width	= 64;
		int				height	= 64;
		ConfigInfo		info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pbuffer surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		// Clamp to maximums reported by implementation
		width	= deMin32(width, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_WIDTH));
		height	= deMin32(height, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_HEIGHT));

		if (width == 0 || height == 0)
		{
			log << TestLog::Message << "    Fail, maximum pbuffer size of " << width << "x" << height << " reported" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid maximum pbuffer size");
			return;
		}

		const EGLint attribs[] =
		{
			EGL_WIDTH,			width,
			EGL_HEIGHT,			height,
			EGL_TEXTURE_FORMAT,	EGL_NO_TEXTURE,
			EGL_NONE
		};

		eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, attribs));

		testAttributes(display, *surface, EGL_PBUFFER_BIT, info);
	}